

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O2

int dwarf_get_DEFAULTED_name(uint val,char **s_out)

{
  if (val < 3) {
    *s_out = &DAT_00200038 + *(int *)(&DAT_00200038 + (ulong)val * 4);
    return 0;
  }
  return -1;
}

Assistant:

int
dwarf_get_DEFAULTED_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_DEFAULTED_no:
        *s_out = "DW_DEFAULTED_no";
        return DW_DLV_OK;
    case DW_DEFAULTED_in_class:
        *s_out = "DW_DEFAULTED_in_class";
        return DW_DLV_OK;
    case DW_DEFAULTED_out_of_class:
        *s_out = "DW_DEFAULTED_out_of_class";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}